

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void kj::anon_unknown_70::validateExceptionPointer(ExceptionImpl *e)

{
  bool bVar1;
  bool local_62;
  Fault local_58;
  Fault f;
  ExceptionImpl **local_48;
  DebugComparison<const_kj::ExceptionImpl_*&,_std::nullptr_t> local_40;
  bool local_11;
  ExceptionImpl *pEStack_10;
  bool _kjCondition;
  ExceptionImpl *e_local;
  
  pEStack_10 = e;
  local_48 = (ExceptionImpl **)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffff0);
  f.exception = (Exception *)0x0;
  kj::_::DebugExpression<kj::ExceptionImpl_const*&>::operator==
            (&local_40,(DebugExpression<kj::ExceptionImpl_const*&> *)&local_48,&f.exception);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_40);
  local_62 = bVar1 || (ExceptionImpl *)0xfff < pEStack_10;
  local_11 = local_62;
  if (bVar1 || (ExceptionImpl *)0xfff < pEStack_10) {
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[37],kj::ExceptionImpl_const*&>
            (&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
             ,0x470,FAILED,"e == nullptr || reinterpret_cast<uintptr_t>(e) >= 4096",
             "_kjCondition,\"detected bogus ExceptionImpl pointer\", e",&local_11,
             (char (*) [37])"detected bogus ExceptionImpl pointer",&stack0xfffffffffffffff0);
  kj::_::Debug::Fault::fatal(&local_58);
}

Assistant:

void validateExceptionPointer(const ExceptionImpl* e) noexcept {
  // Occasionally in production we are seeing `currentException` have the value 1. Try to figure
  // this out...
  KJ_ASSERT(e == nullptr || reinterpret_cast<uintptr_t>(e) >= 4096,
      "detected bogus ExceptionImpl pointer", e);
}